

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

int obinary_float32(p_ply ply,double value)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  float float32;
  undefined1 local_4 [4];
  
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = value;
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar2 = vandpd_avx512vl(auVar3._0_16_,auVar2);
  iVar1 = 0;
  if (auVar2._0_8_ <= 3.4028234663852886e+38) {
    iVar1 = (*ply->odriver->ochunk)(ply,local_4,4);
  }
  return iVar1;
}

Assistant:

static int obinary_float32(p_ply ply, double value) {
    float float32 = (float)value;
    if (value > FLT_MAX || value < -FLT_MAX) return 0;
    return ply->odriver->ochunk(ply, &float32, sizeof(float32));
}